

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O2

uint32_t longest_match_slow_avx2(deflate_state *s,Pos cur_match)

{
  uint uVar1;
  uchar *puVar2;
  Pos *pPVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uchar *puVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uchar *puVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong local_c0;
  ulong local_68;
  
  uVar14 = (ulong)cur_match;
  uVar9 = s->strstart;
  uVar20 = (ulong)uVar9;
  uVar1 = s->w_mask;
  puVar2 = s->window;
  uVar13 = 2;
  if (s->prev_length != 0) {
    uVar13 = s->prev_length;
  }
  uVar16 = 0xffffffff;
  if (3 < uVar13) {
    uVar16 = (uint)(uVar13 < 8) << 2 | 0xfffffff9;
  }
  uVar24 = *(ulong *)(puVar2 + (uVar16 + uVar13) + uVar20);
  puVar17 = puVar2 + (uVar16 + uVar13);
  uVar16 = s->lookahead;
  uVar21 = s->max_chain_length >> 2;
  if (uVar13 < s->good_match) {
    uVar21 = s->max_chain_length;
  }
  uVar6 = s->w_size - 0x106;
  uVar19 = uVar9 - uVar6;
  local_c0 = 0;
  if (uVar9 < uVar6 || uVar19 == 0) {
    uVar19 = 0;
  }
  pPVar3 = s->prev;
  lVar4 = *(long *)(puVar2 + uVar20);
  uVar6 = s->nice_match;
  puVar10 = puVar2;
  uVar12 = uVar19;
  if (2 < uVar13) {
    local_c0 = 0;
    uVar7 = (*s->update_hash)(0,(uint)((ulong)lVar4 >> 8) & 0xff);
    uVar7 = (*s->update_hash)(uVar7,(uint32_t)puVar2[uVar20 + 2]);
    for (uVar12 = 3; uVar12 <= uVar13; uVar12 = uVar12 + 1) {
      uVar7 = (*s->update_hash)(uVar7,(uint32_t)puVar2[uVar12 + uVar20]);
      if (s->head[uVar7] < (ushort)uVar14) {
        local_c0 = (ulong)(uVar12 - 2);
        uVar14 = (ulong)s->head[uVar7];
      }
    }
    uVar12 = (int)local_c0 + uVar19;
    if ((ushort)uVar14 <= (ushort)uVar12) {
LAB_00110b4d:
      uVar9 = s->lookahead;
      if (uVar13 < s->lookahead) {
        uVar9 = uVar13;
      }
      return uVar9;
    }
    puVar17 = puVar17 + -(local_c0 & 0xffff);
    puVar10 = puVar2 + -(local_c0 & 0xffff);
  }
  uVar15 = uVar24 >> 0x10 & 0xffff;
  local_68 = uVar24 >> 0x20;
LAB_00110836:
  uVar23 = uVar13;
  do {
    if (uVar9 <= ((uint)uVar14 & 0xffff)) {
      return uVar23;
    }
    uVar11 = (ushort)uVar12;
    if (uVar23 < 4) {
      while( true ) {
        uVar22 = (uint)uVar14;
        uVar18 = uVar14 & 0xffff;
        if ((*(short *)(puVar17 + uVar18) == (short)uVar24) &&
           (*(short *)(puVar10 + uVar18) == (short)lVar4)) break;
        if (uVar21 == 1) {
          return uVar23;
        }
        uVar14 = (ulong)pPVar3[(uint)uVar18 & uVar1];
        uVar21 = uVar21 - 1;
        if (pPVar3[(uint)uVar18 & uVar1] <= uVar11) {
          return uVar23;
        }
      }
    }
    else if (uVar23 < 8) {
      while( true ) {
        uVar22 = (uint)uVar14;
        uVar18 = uVar14 & 0xffff;
        if ((*(uint *)(puVar17 + uVar18) == ((int)uVar15 << 0x10 | (uint)(uVar24 & 0xffff))) &&
           (*(int *)(puVar10 + uVar18) == (int)lVar4)) break;
        if (uVar21 == 1) {
          return uVar23;
        }
        uVar14 = (ulong)pPVar3[(uint)uVar18 & uVar1];
        uVar21 = uVar21 - 1;
        if (pPVar3[(uint)uVar18 & uVar1] <= uVar11) {
          return uVar23;
        }
      }
    }
    else {
      while( true ) {
        uVar22 = (uint)uVar14;
        uVar18 = uVar14 & 0xffff;
        if ((*(ulong *)(puVar17 + uVar18) ==
             (local_68 << 0x20 | uVar24 & 0xffff | (ulong)(uint)((int)uVar15 << 0x10))) &&
           (*(long *)(puVar10 + uVar18) == lVar4)) break;
        if (uVar21 == 1) {
          return uVar23;
        }
        uVar14 = (ulong)pPVar3[(uint)uVar18 & uVar1];
        uVar21 = uVar21 - 1;
        if (pPVar3[(uint)uVar18 & uVar1] <= uVar11) {
          return uVar23;
        }
      }
    }
    uVar7 = compare256_avx2_static(puVar2 + uVar20 + 2,puVar10 + uVar18 + 2);
    uVar13 = uVar7 + 2;
    if (uVar23 < uVar13) {
      uVar23 = (uVar22 & 0xffff) - (uint)(ushort)local_c0;
      uVar14 = (ulong)uVar23;
      s->match_start = uVar23;
      if (uVar16 < uVar13) {
        return uVar16;
      }
      if (uVar6 <= uVar13) {
        return uVar13;
      }
      uVar5 = uVar7 - 5;
      if (uVar13 < 8) {
        uVar5 = uVar7 - 1;
      }
      if (uVar13 < 4) {
        uVar5 = uVar7 + 1;
      }
      uVar18 = (ulong)uVar5;
      uVar24 = *(ulong *)(puVar2 + uVar18 + uVar20);
      uVar15 = uVar24 >> 0x10 & 0xffff;
      local_68 = uVar24 >> 0x20;
      if ((3 < uVar13) && (uVar23 + uVar13 < uVar9)) break;
      puVar17 = puVar10 + uVar18;
      uVar23 = uVar13;
    }
    uVar21 = uVar21 - 1;
    if (uVar21 == 0) {
      return uVar23;
    }
    uVar14 = (ulong)pPVar3[uVar22 & 0xffff & uVar1];
    if (pPVar3[uVar22 & 0xffff & uVar1] <= uVar11) {
      return uVar23;
    }
  } while( true );
  local_c0 = 0;
  uVar12 = 0;
  while( true ) {
    if (uVar7 - 1 < uVar12) break;
    uVar11 = pPVar3[(uVar23 & 0xffff) + uVar12 & uVar1];
    if (uVar11 < (ushort)uVar14) {
      if ((uint)uVar11 <= (uVar19 & 0xffff) + uVar12) goto LAB_00110b4d;
      uVar14 = (ulong)uVar11;
      local_c0 = (ulong)uVar12;
    }
    uVar12 = uVar12 + 1;
  }
  uVar8 = (*s->update_hash)(0,(uint32_t)puVar2[(ulong)uVar13 + (uVar20 - 4)]);
  uVar8 = (*s->update_hash)(uVar8,(uint32_t)puVar2[(ulong)uVar13 + (uVar20 - 3)]);
  uVar8 = (*s->update_hash)(uVar8,(uint32_t)puVar2[(ulong)uVar13 + (uVar20 - 2)]);
  uVar11 = s->head[uVar8];
  if (uVar11 < (ushort)uVar14) {
    local_c0 = (ulong)(uVar7 - 2);
    uVar14 = (ulong)uVar11;
    if ((uint)uVar11 <= (uVar7 - 2 & 0xffff) + (uVar19 & 0xffff)) goto LAB_00110b4d;
  }
  uVar12 = (int)local_c0 + uVar19;
  puVar10 = puVar2 + -(local_c0 & 0xffff);
  puVar17 = puVar10 + uVar18;
  goto LAB_00110836;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}